

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicKReach.cpp
# Opt level: O0

void __thiscall
DynamicKReach::update_remove
          (DynamicKReach *this,vertex_t v,vector<unsigned_int,_std::allocator<unsigned_int>_> *out,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *dist)

{
  byte *pbVar1;
  reference pvVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *dist_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *out_local;
  vertex_t v_local;
  DynamicKReach *this_local;
  
  pbVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,(ulong)v);
  if (*pbVar1 <= this->k_) {
    pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,(ulong)v);
    *pvVar2 = '?';
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&this->updated_);
    collect_changes(this,out,dist);
    fix_changes(this,dist);
  }
  return;
}

Assistant:

void DynamicKReach::update_remove(vertex_t v, const std::vector<vertex_t> &out, std::vector<distance_t> &dist) {
    if (dist.at(v) > k_) {
        return;
    }
    dist.at(v) = INF8;
    updated_.clear();
    collect_changes(out, dist);
    fix_changes(dist);
}